

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

JavascriptEnumerator * __thiscall
Js::TypedArrayBase::GetIndexEnumerator
          (TypedArrayBase *this,EnumeratorFlags flags,ScriptContext *requestContext)

{
  Recycler *alloc;
  TypedArrayIndexEnumerator *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&TypedArrayIndexEnumerator::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_8fd05b2;
  data.filename._0_4_ = 0x299;
  alloc = Memory::Recycler::TrackAllocInfo(requestContext->recycler,(TrackAllocData *)local_50);
  this_00 = (TypedArrayIndexEnumerator *)new<Memory::Recycler>(0x20,alloc,0x37a1d4);
  TypedArrayIndexEnumerator::TypedArrayIndexEnumerator(this_00,this,flags,requestContext);
  return &this_00->super_JavascriptEnumerator;
}

Assistant:

JavascriptEnumerator * TypedArrayBase::GetIndexEnumerator(EnumeratorFlags flags, ScriptContext * requestContext)
    {
        return RecyclerNew(requestContext->GetRecycler(), TypedArrayIndexEnumerator, this, flags, requestContext);
    }